

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::ReduceRightObjectHelper<unsigned_long>
              (RecyclableObject *obj,unsigned_long length,unsigned_long start,
              RecyclableObject *callBackFn,Var accumulator,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *this;
  RecyclableObject *pRVar2;
  BOOL BVar3;
  Var pvVar4;
  JavascriptMethod p_Var5;
  Var pvVar6;
  uint64 index;
  undefined1 local_78 [8];
  JsReentLock jsReentLock;
  Var local_50;
  
  local_78 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_78)->noJsReentrancy;
  ((ThreadContext *)local_78)->noJsReentrancy = true;
  jsReentLock._24_8_ = obj;
  JsReentLock::setObjectForMutation((JsReentLock *)local_78,obj);
  index = ~start + length;
  local_50 = accumulator;
  for (; start < length; start = start + 1) {
    *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    BVar3 = JavascriptOperators::HasItem((RecyclableObject *)jsReentLock._24_8_,index);
    JsReentLock::MutateArrayObject((JsReentLock *)local_78);
    *(bool *)((long)local_78 + 0x108) = true;
    if (BVar3 != 0) {
      *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pvVar4 = JavascriptOperators::GetItem
                         ((RecyclableObject *)jsReentLock._24_8_,index,scriptContext);
      this = scriptContext->threadContext;
      bVar1 = this->reentrancySafeOrHandled;
      this->reentrancySafeOrHandled = true;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
      ThreadContext::AssertJsReentrancy(scriptContext->threadContext);
      p_Var5 = RecyclableObject::GetEntryPoint(callBackFn);
      CheckIsExecutable(callBackFn,p_Var5);
      p_Var5 = RecyclableObject::GetEntryPoint(callBackFn);
      pRVar2 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue.ptr;
      pvVar6 = JavascriptNumber::ToVar(index,scriptContext);
      local_50 = (*p_Var5)(callBackFn,(CallInfo)callBackFn,0x2000005,0,0,0,0,0x2000005,pRVar2,
                           local_50,pvVar4,pvVar6,jsReentLock._24_8_);
      this->reentrancySafeOrHandled = bVar1;
      JsReentLock::MutateArrayObject((JsReentLock *)local_78);
      *(bool *)((long)local_78 + 0x108) = true;
    }
    index = index - 1;
  }
  *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_50;
}

Assistant:

Var JavascriptArray::ReduceRightObjectHelper(RecyclableObject* obj, T length, T start, RecyclableObject* callBackFn, Var accumulator, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        Var element = nullptr;
        T index = 0;

        for (T k = start; k < length; k++)
        {
            index = length - k - 1;
            JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, index));
            if (hasItem)
            {
                JS_REENTRANT(jsReentLock,
                    element = JavascriptOperators::GetItem(obj, index, scriptContext);
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        accumulator = CALL_FUNCTION(scriptContext->GetThreadContext(),
                                callBackFn, CallInfo(CallFlags_Value, 5), scriptContext->GetLibrary()->GetUndefined(),
                                accumulator,
                                element,
                                JavascriptNumber::ToVar(index, scriptContext),
                                obj);
                    }
                    END_SAFE_REENTRANT_CALL
                );
            }
        }

        return accumulator;
    }